

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableObjectWalker::Get
          (RecyclableObjectWalker *this,int index,ResolvedObject *pResolvedObject)

{
  Type pDVar1;
  Var pvVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Type *ppIVar9;
  Type *ppDVar10;
  PropertyRecord *pPVar11;
  RecyclableObject *this_00;
  ArenaAllocator *alloc;
  RecyclableObjectAddress *this_01;
  int iVar12;
  LPCSTR message;
  LPCSTR error;
  Type TVar13;
  uint lineNumber;
  int index_00;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x8ea,"(pResolvedObject)",
                                "Bad usage of RecyclableObjectWalker::Get");
    if (!bVar4) goto LAB_008c39e8;
    *puVar8 = 0;
  }
  iVar5 = 0;
  iVar6 = 0;
  if (this->fakeGroupObjectWalkerList !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar6 = (this->fakeGroupObjectWalkerList->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  }
  if (this->innerArrayObjectWalker != (RecyclableArrayWalker *)0x0) {
    iVar5 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
              super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
  }
  if (((-1 < index) &&
      (this->pMembersList !=
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0)) &&
     (index < iVar6 + iVar5 +
              (this->pMembersList->
              super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count)) {
    bVar4 = VarIs<Js::RecyclableObject>(this->instance);
    iVar12 = 0;
    if (bVar4) {
      iVar12 = (this->pMembersList->
               super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               ).count;
    }
    index_00 = index - iVar6;
    if (index < iVar6) {
      if (this->fakeGroupObjectWalkerList ==
          (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x8f9,"(fakeGroupObjectWalkerList)","fakeGroupObjectWalkerList"
                                   );
        if (!bVar4) goto LAB_008c39e8;
        *puVar8 = 0;
      }
      ppIVar9 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->fakeGroupObjectWalkerList,index);
      iVar6 = (*(*ppIVar9)->_vptr_IDiagObjectModelWalkerBase[2])(*ppIVar9,pResolvedObject);
      return iVar6;
    }
    if (index_00 < iVar12) {
      bVar4 = VarIs<Js::RecyclableObject>(this->instance);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x901,"(Js::VarIs<Js::RecyclableObject>(instance))",
                                    "Js::VarIs<Js::RecyclableObject>(instance)");
        if (!bVar4) goto LAB_008c39e8;
        *puVar8 = 0;
      }
      ppDVar10 = JsUtil::
                 List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->pMembersList,index_00);
      iVar6 = (*ppDVar10)->propId;
      pResolvedObject->propId = iVar6;
      if (iVar6 - 0x10U < 0xffffffef) {
        ppDVar10 = JsUtil::
                   List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this->pMembersList,index_00);
        pDVar1 = *ppDVar10;
        pPVar11 = ScriptContext::GetPropertyName(this->scriptContext,pResolvedObject->propId);
        pResolvedObject->name = (LPCWSTR)(pPVar11 + 1);
        pvVar2 = pDVar1->aVar;
        pResolvedObject->obj = pvVar2;
        if (pvVar2 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x910,"(pResolvedObject->obj)","pResolvedObject->obj");
          if (!bVar4) goto LAB_008c39e8;
          *puVar8 = 0;
        }
        pResolvedObject->scriptContext = this->scriptContext;
        pvVar2 = pResolvedObject->obj;
        if (pvVar2 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_008c39e8;
          *puVar8 = 0;
        }
        bVar4 = TaggedInt::Is(pvVar2);
        TVar13 = TypeIds_FirstNumberType;
        if ((!bVar4) && (TVar13 = TypeIds_Number, (ulong)pvVar2 >> 0x32 == 0)) {
          this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
          if (this_00 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar4) goto LAB_008c39e8;
            *puVar8 = 0;
          }
          TVar13 = ((this_00->type).ptr)->typeId;
          if ((0x57 < (int)TVar13) && (BVar7 = RecyclableObject::IsExternal(this_00), BVar7 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_008c39e8;
            *puVar8 = 0;
          }
        }
        pResolvedObject->typeId = TVar13;
        alloc = GetArenaFromContext(this->scriptContext);
        this_01 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
        RecyclableObjectAddress::RecyclableObjectAddress
                  (this_01,this->instance,pResolvedObject->propId,pResolvedObject->obj,
                   pDVar1->flags >> 1 & 1);
        pResolvedObject->address = (IDiagObjectAddress *)this_01;
        pResolvedObject->isConst = (bool)((byte)pDVar1->flags & 1);
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      error = "(0)";
      message = "FALSE";
      lineNumber = 0x907;
    }
    else {
      if (index_00 - iVar12 < iVar5) {
        if (this->innerArrayObjectWalker == (RecyclableArrayWalker *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x925,"(innerArrayObjectWalker)","innerArrayObjectWalker");
          if (!bVar4) goto LAB_008c39e8;
          *puVar8 = 0;
        }
        iVar6 = (**(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
                   super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase)
                          (this->innerArrayObjectWalker,(ulong)(uint)(index_00 - iVar12),
                           pResolvedObject);
        return iVar6;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      error = "(false)";
      message = "false";
      lineNumber = 0x929;
    }
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,lineNumber,error,message);
    if (!bVar4) {
LAB_008c39e8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  return 0;
}

Assistant:

BOOL RecyclableObjectWalker::Get(int index, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableObjectWalker::Get");

        int fakeObjCount = fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0;
        int arrayItemCount = innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0;

        if (index < 0 || !pMembersList || index >= (pMembersList->Count() + arrayItemCount + fakeObjCount))
        {
            return FALSE;
        }

        int nonArrayElementCount = Js::VarIs<Js::RecyclableObject>(instance) ? pMembersList->Count() : 0;

        // First the virtual groups
        if (index < fakeObjCount)
        {
            Assert(fakeGroupObjectWalkerList);
            return fakeGroupObjectWalkerList->Item(index)->GetGroupObject(pResolvedObject);
        }

        index -= fakeObjCount;

        if (index < nonArrayElementCount)
        {
            Assert(Js::VarIs<Js::RecyclableObject>(instance));

            pResolvedObject->propId = pMembersList->Item(index)->propId;

            if (pResolvedObject->propId == Js::Constants::NoProperty || Js::IsInternalPropertyId(pResolvedObject->propId))
            {
                Assert(FALSE);
                return FALSE;
            }

            Js::DebuggerPropertyDisplayInfo* displayInfo = pMembersList->Item(index);
            const Js::PropertyRecord* propertyRecord = scriptContext->GetPropertyName(pResolvedObject->propId);

            pResolvedObject->name = propertyRecord->GetBuffer();
            pResolvedObject->obj = displayInfo->aVar;
            Assert(pResolvedObject->obj);

            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                RecyclableObjectAddress,
                instance,
                pResolvedObject->propId,
                pResolvedObject->obj,
                displayInfo->IsInDeadZone() ? TRUE : FALSE);

            pResolvedObject->isConst = displayInfo->IsConst();

            return TRUE;
        }

        index -= nonArrayElementCount;

        if (index < arrayItemCount)
        {
            Assert(innerArrayObjectWalker);
            return innerArrayObjectWalker->Get(index, pResolvedObject);
        }

        Assert(false);
        return FALSE;
    }